

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void addModuleArgument(sqlite3 *db,Table *pTable,char *zArg)

{
  int iVar1;
  char **ppcVar2;
  int i;
  char **azModuleArg;
  int nBytes;
  char *zArg_local;
  Table *pTable_local;
  sqlite3 *db_local;
  
  ppcVar2 = (char **)sqlite3DbRealloc(db,pTable->azModuleArg,(long)((pTable->nModuleArg + 2) * 8));
  if (ppcVar2 == (char **)0x0) {
    sqlite3DbFree(db,zArg);
  }
  else {
    iVar1 = pTable->nModuleArg;
    pTable->nModuleArg = iVar1 + 1;
    ppcVar2[iVar1] = zArg;
    ppcVar2[iVar1 + 1] = (char *)0x0;
    pTable->azModuleArg = ppcVar2;
  }
  return;
}

Assistant:

static void addModuleArgument(sqlite3 *db, Table *pTable, char *zArg){
  int nBytes = sizeof(char *)*(2+pTable->nModuleArg);
  char **azModuleArg;
  azModuleArg = sqlite3DbRealloc(db, pTable->azModuleArg, nBytes);
  if( azModuleArg==0 ){
    sqlite3DbFree(db, zArg);
  }else{
    int i = pTable->nModuleArg++;
    azModuleArg[i] = zArg;
    azModuleArg[i+1] = 0;
    pTable->azModuleArg = azModuleArg;
  }
}